

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::addCopyTests
               (TestCaseGroup *root,deUint32 srcFormat,deUint32 dstFormat)

{
  deUint32 target;
  deUint32 target_00;
  Context *context;
  bool bVar1;
  CompressedTexFormat CVar2;
  TestCaseGroup *this;
  char *pcVar3;
  TestCase *this_00;
  deUint32 format;
  deUint32 *pdVar4;
  undefined4 in_register_00000034;
  TestCaseGroup *this_01;
  long lVar5;
  long lVar6;
  IVec3 local_e4;
  TestCaseGroup *local_d8;
  undefined1 local_d0 [32];
  undefined1 local_b0 [32];
  TestCaseGroup *local_90;
  string targetTestName;
  IVec3 dstSize;
  IVec3 srcSize;
  string groupName;
  
  local_d8 = root;
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            ((string *)local_b0,(_anonymous_namespace_ *)CONCAT44(in_register_00000034,srcFormat),
             dstFormat);
  std::operator+(&targetTestName,(string *)local_b0,"_");
  Functional::(anonymous_namespace)::formatToName_abi_cxx11_
            ((string *)local_d0,(_anonymous_namespace_ *)(ulong)dstFormat,format);
  std::operator+(&groupName,&targetTestName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0);
  this_01 = local_d8;
  std::__cxx11::string::~string((string *)local_d0);
  std::__cxx11::string::~string((string *)&targetTestName);
  std::__cxx11::string::~string((string *)local_b0);
  this = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this,this_01->m_context,groupName._M_dataplus._M_p,groupName._M_dataplus._M_p);
  local_90 = this;
  tcu::TestNode::addChild((TestNode *)this_01,(TestNode *)this);
  lVar5 = 0;
  do {
    if (lVar5 == 5) {
      std::__cxx11::string::~string((string *)&groupName);
      return;
    }
    target = (&DAT_018df990)[lVar5];
    bVar1 = glu::isCompressedFormat(srcFormat);
    if (lVar5 != 4 || !bVar1) {
      if (lVar5 == 4) {
        bVar1 = isColorRenderable(srcFormat);
        if (!bVar1) goto LAB_0139fc94;
      }
      bVar1 = glu::isCompressedFormat(srcFormat);
      if (bVar1) {
        CVar2 = glu::mapGLCompressedTexFormat(srcFormat);
        bVar1 = tcu::isAstcFormat(CVar2);
        if (((uint)lVar5 & 5) == 1 && !bVar1) goto LAB_0139fc94;
      }
      pdVar4 = &DAT_018df990;
      for (lVar6 = 0; lVar6 != 5; lVar6 = lVar6 + 1) {
        target_00 = *pdVar4;
        bVar1 = glu::isCompressedFormat(dstFormat);
        if (lVar6 != 4 || !bVar1) {
          if (lVar6 == 4) {
            bVar1 = isColorRenderable(dstFormat);
            if (!bVar1) goto LAB_0139fef6;
          }
          bVar1 = glu::isCompressedFormat(dstFormat);
          if (bVar1) {
            CVar2 = glu::mapGLCompressedTexFormat(dstFormat);
            bVar1 = tcu::isAstcFormat(CVar2);
            if (((uint)lVar6 & 5) == 1 && !bVar1) goto LAB_0139fef6;
          }
          pcVar3 = targetToName(target);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_d0,pcVar3,(allocator<char> *)&local_e4);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_d0,"_to_");
          pcVar3 = targetToName(target_00);
          std::operator+(&targetTestName,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_b0,pcVar3);
          std::__cxx11::string::~string((string *)local_b0);
          std::__cxx11::string::~string((string *)local_d0);
          bVar1 = glu::isCompressedFormat(srcFormat);
          if (bVar1) {
            local_e4.m_data[0] = 0x80;
            local_e4.m_data[2] = 0x10;
          }
          else {
            bVar1 = glu::isCompressedFormat(dstFormat);
            local_e4.m_data[2] = (uint)bVar1 * 8 + 8;
            local_e4.m_data[0] = (uint)bVar1 * 0x40 + 0x40;
          }
          local_e4.m_data[1] = local_e4.m_data[0];
          getTestedSize((anon_unknown_0 *)&srcSize,target,srcFormat,&local_e4);
          getTestedSize((anon_unknown_0 *)&dstSize,target_00,dstFormat,&local_e4);
          this_00 = (TestCase *)operator_new(0xb0);
          context = this_01->m_context;
          local_b0._0_4_ = srcFormat;
          local_b0._4_4_ = target;
          tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(local_b0 + 8),&srcSize);
          local_d0._0_4_ = dstFormat;
          local_d0._4_4_ = target_00;
          tcu::Vector<int,_3>::Vector((Vector<int,_3> *)(local_d0 + 8),&dstSize);
          gles31::TestCase::TestCase
                    (this_00,context,targetTestName._M_dataplus._M_p,targetTestName._M_dataplus._M_p
                    );
          (this_00->super_TestCase).super_TestNode._vptr_TestNode =
               (_func_int **)&PTR__CopyImageTest_01e61940;
          ImageInfo::ImageInfo((ImageInfo *)(this_00 + 1),(ImageInfo *)local_b0);
          ImageInfo::ImageInfo
                    ((ImageInfo *)
                     ((long)&this_00[1].super_TestCase.super_TestNode.m_name._M_dataplus._M_p + 4),
                     (ImageInfo *)local_d0);
          *(undefined4 *)((long)&this_00[1].super_TestCase.super_TestNode.m_name.field_2 + 8) = 0;
          this_00[1].super_TestCase.super_TestNode.m_description._M_dataplus._M_p = (pointer)0x0;
          tcu::TestNode::addChild((TestNode *)local_90,(TestNode *)this_00);
          std::__cxx11::string::~string((string *)&targetTestName);
          this_01 = local_d8;
        }
LAB_0139fef6:
        pdVar4 = pdVar4 + 1;
      }
    }
LAB_0139fc94:
    lVar5 = lVar5 + 1;
  } while( true );
}

Assistant:

void addCopyTests (TestCaseGroup* root, deUint32 srcFormat, deUint32 dstFormat)
{
	const string			groupName	= string(formatToName(srcFormat)) + "_" + formatToName(dstFormat);
	TestCaseGroup* const	group		= new TestCaseGroup(root->getContext(), groupName.c_str(), groupName.c_str());

	const deUint32 targets[] =
	{
		GL_TEXTURE_2D,
		GL_TEXTURE_3D,
		GL_TEXTURE_CUBE_MAP,
		GL_TEXTURE_2D_ARRAY,
		GL_RENDERBUFFER
	};

	root->addChild(group);

	for (int srcTargetNdx = 0; srcTargetNdx < DE_LENGTH_OF_ARRAY(targets); srcTargetNdx++)
	{
		const deUint32	srcTarget				= targets[srcTargetNdx];
		const bool		srcIs3D					= srcTarget == GL_TEXTURE_2D_ARRAY || srcTarget == GL_TEXTURE_3D;

		if (glu::isCompressedFormat(srcFormat) && srcTarget == GL_RENDERBUFFER)
			continue;

		if (srcTarget == GL_RENDERBUFFER && !isColorRenderable(srcFormat))
			continue;

		if (glu::isCompressedFormat(srcFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(srcFormat)) && srcIs3D)
			continue;

		for (int dstTargetNdx = 0; dstTargetNdx < DE_LENGTH_OF_ARRAY(targets); dstTargetNdx++)
		{
			const deUint32	dstTarget				= targets[dstTargetNdx];
			const bool		dstIs3D					= dstTarget == GL_TEXTURE_2D_ARRAY || dstTarget == GL_TEXTURE_3D;

			if (glu::isCompressedFormat(dstFormat) && dstTarget == GL_RENDERBUFFER)
				continue;

			if (dstTarget == GL_RENDERBUFFER && !isColorRenderable(dstFormat))
				continue;

			if (glu::isCompressedFormat(dstFormat) && !tcu::isAstcFormat(glu::mapGLCompressedTexFormat(dstFormat)) && dstIs3D)
				continue;

			const string	targetTestName	= string(targetToName(srcTarget)) + "_to_" + targetToName(dstTarget);

			// Compressed formats require more space to fit all block size combinations.
			const bool		isCompressedCase	= glu::isCompressedFormat(srcFormat) || glu::isCompressedFormat(dstFormat);
			const IVec3		targetSize			= isCompressedCase ? IVec3(128, 128, 16) : IVec3(64, 64, 8);
			const IVec3		srcSize				= getTestedSize(srcTarget, srcFormat, targetSize);
			const IVec3		dstSize				= getTestedSize(dstTarget, dstFormat, targetSize);

			group->addChild(new CopyImageTest(root->getContext(),
											ImageInfo(srcFormat, srcTarget, srcSize),
											ImageInfo(dstFormat, dstTarget, dstSize),
											targetTestName.c_str(), targetTestName.c_str()));
		}
	}
}